

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

void __thiscall Js::ScriptContext::InitializeGlobalObject(ScriptContext *this)

{
  GlobalObject *obj;
  Recycler *this_00;
  ThreadContext *this_01;
  GlobalObject *localGlobalObject;
  ScriptContext *this_local;
  
  obj = GlobalObject::New(this);
  this_00 = GetRecycler(this);
  Memory::Recycler::RootAddRef(this_00,obj,(uint *)0x0);
  (this->super_ScriptContextBase).globalObject = obj;
  GlobalObject::Initialize((this->super_ScriptContextBase).globalObject,this);
  this_01 = GetThreadContext(this);
  ThreadContext::RegisterScriptContext(this_01,this);
  return;
}

Assistant:

void ScriptContext::InitializeGlobalObject()
    {
        GlobalObject * localGlobalObject = GlobalObject::New(this);
        GetRecycler()->RootAddRef(localGlobalObject);

        // Assigned the global Object after we have successfully AddRef (in case of OOM)
        globalObject = localGlobalObject;
        globalObject->Initialize(this);

        this->GetThreadContext()->RegisterScriptContext(this);
    }